

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

void Aig_ManDeriveCounterExample(Aig_Man_t *p,Vec_Int_t *vNode2Var,sat_solver *pSat)

{
  int Entry;
  Vec_Int_t *p_00;
  void *pvVar1;
  int *piVar2;
  int i;
  
  p_00 = Vec_IntAlloc(p->nObjs[2]);
  for (i = 0; i < p->vCis->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vCis,i);
    Entry = Vec_IntEntry(vNode2Var,*(int *)((long)pvVar1 + 0x24));
    Vec_IntPush(p_00,Entry);
  }
  piVar2 = Sat_SolverGetModel(pSat,p_00->pArray,p_00->nSize);
  p->pData = piVar2;
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Aig_ManDeriveCounterExample( Aig_Man_t * p, Vec_Int_t * vNode2Var, sat_solver * pSat )
{ 
    Vec_Int_t * vPisIds;
    Aig_Obj_t * pObj;
    int i;
    // collect IDs of PI variables
    // (fanoutless PIs have SAT var 0, which is an unused in the SAT solver -> has value 0)
    vPisIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vPisIds, Vec_IntEntry(vNode2Var, Aig_ObjId(pObj)) );
    // derive the SAT assignment
    p->pData = Sat_SolverGetModel( pSat, vPisIds->pArray, vPisIds->nSize );
    Vec_IntFree( vPisIds );
}